

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddTriangleFilled(ImDrawList *this,ImVec2 *p1,ImVec2 *p2,ImVec2 *p3,ImU32 col)

{
  ImDrawList *in_RDI;
  uint in_R8D;
  undefined4 in_stack_ffffffffffffffc8;
  ImU32 in_stack_ffffffffffffffcc;
  
  if ((in_R8D & 0xff000000) != 0) {
    PathLineTo(in_RDI,(ImVec2 *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    PathLineTo(in_RDI,(ImVec2 *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    PathLineTo(in_RDI,(ImVec2 *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    PathFillConvex(in_RDI,in_stack_ffffffffffffffcc);
  }
  return;
}

Assistant:

void ImDrawList::AddTriangleFilled(const ImVec2& p1, const ImVec2& p2, const ImVec2& p3, ImU32 col)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    PathLineTo(p1);
    PathLineTo(p2);
    PathLineTo(p3);
    PathFillConvex(col);
}